

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_java.cpp
# Opt level: O3

void flatbuffers::java::GenStructBody(StructDef *struct_def,string *code_ptr,char *nameprefix)

{
  BaseType BVar1;
  FieldDef *in;
  StructDef *struct_def_00;
  pointer pcVar2;
  char *pcVar3;
  long *plVar4;
  undefined8 *puVar5;
  long *plVar6;
  _Alloc_hider _Var7;
  pointer ppFVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long *local_a0;
  long local_98;
  long local_90;
  long lStack_88;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  string local_60;
  StructDef *local_40;
  char *local_38;
  
  local_40 = struct_def;
  local_38 = nameprefix;
  NumToString<unsigned_long>(&local_60,struct_def->minalign);
  plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,0x1209d3);
  plVar6 = plVar4 + 2;
  if ((long *)*plVar4 == plVar6) {
    local_70 = *plVar6;
    lStack_68 = plVar4[3];
    local_80 = &local_70;
  }
  else {
    local_70 = *plVar6;
    local_80 = (long *)*plVar4;
  }
  local_78 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_80);
  plVar6 = plVar4 + 2;
  if ((long *)*plVar4 == plVar6) {
    local_90 = *plVar6;
    lStack_88 = plVar4[3];
    local_a0 = &local_90;
  }
  else {
    local_90 = *plVar6;
    local_a0 = (long *)*plVar4;
  }
  local_98 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_a0);
  if (local_a0 != &local_90) {
    operator_delete(local_a0);
  }
  if (local_80 != &local_70) {
    operator_delete(local_80);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  ppFVar8 = (local_40->fields).vec.
            super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppFVar8 !=
      (local_40->fields).vec.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    do {
      in = ppFVar8[-1];
      if (in->padding != 0) {
        NumToString<unsigned_long>(&local_60,in->padding);
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,0x1209ec);
        plVar4 = puVar5 + 2;
        if ((long *)*puVar5 == plVar4) {
          local_70 = *plVar4;
          lStack_68 = puVar5[3];
          local_80 = &local_70;
        }
        else {
          local_70 = *plVar4;
          local_80 = (long *)*puVar5;
        }
        local_78 = puVar5[1];
        *puVar5 = plVar4;
        puVar5[1] = 0;
        *(undefined1 *)(puVar5 + 2) = 0;
        puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_80);
        plVar4 = puVar5 + 2;
        if ((long *)*puVar5 == plVar4) {
          local_90 = *plVar4;
          lStack_88 = puVar5[3];
          local_a0 = &local_90;
        }
        else {
          local_90 = *plVar4;
          local_a0 = (long *)*puVar5;
        }
        local_98 = puVar5[1];
        *puVar5 = plVar4;
        puVar5[1] = 0;
        *(undefined1 *)(puVar5 + 2) = 0;
        std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_a0);
        if (local_a0 != &local_90) {
          operator_delete(local_a0);
        }
        if (local_80 != &local_70) {
          operator_delete(local_80);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p);
        }
      }
      BVar1 = (in->value).type.base_type;
      struct_def_00 = (in->value).type.struct_def;
      if ((BVar1 == BASE_TYPE_STRUCT) && (struct_def_00->fixed == true)) {
        pcVar2 = (struct_def_00->super_Definition).name._M_dataplus._M_p;
        local_a0 = &local_90;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a0,pcVar2,
                   pcVar2 + (struct_def_00->super_Definition).name._M_string_length);
        std::__cxx11::string::append((char *)&local_a0);
        GenStructBody(struct_def_00,code_ptr,(char *)local_a0);
        _Var7._M_p = (pointer)local_a0;
        if (local_a0 != &local_90) {
LAB_0011a852:
          operator_delete(_Var7._M_p);
        }
      }
      else {
        GenMethod_abi_cxx11_(&local_60,(java *)(ulong)BVar1,(FieldDef *)struct_def_00);
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,0x1209fd);
        plVar4 = puVar5 + 2;
        if ((long *)*puVar5 == plVar4) {
          local_70 = *plVar4;
          lStack_68 = puVar5[3];
          local_80 = &local_70;
        }
        else {
          local_70 = *plVar4;
          local_80 = (long *)*puVar5;
        }
        local_78 = puVar5[1];
        *puVar5 = plVar4;
        puVar5[1] = 0;
        *(undefined1 *)(puVar5 + 2) = 0;
        puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_80);
        plVar4 = puVar5 + 2;
        if ((long *)*puVar5 == plVar4) {
          local_90 = *plVar4;
          lStack_88 = puVar5[3];
          local_a0 = &local_90;
        }
        else {
          local_90 = *plVar4;
          local_a0 = (long *)*puVar5;
        }
        local_98 = puVar5[1];
        *puVar5 = plVar4;
        puVar5[1] = 0;
        *(undefined1 *)(puVar5 + 2) = 0;
        std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_a0);
        if (local_a0 != &local_90) {
          operator_delete(local_a0);
        }
        if (local_80 != &local_70) {
          operator_delete(local_80);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p);
        }
        MakeCamel(&local_60,(string *)in,false);
        pcVar3 = local_38;
        strlen(local_38);
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,(ulong)pcVar3);
        plVar4 = puVar5 + 2;
        if ((long *)*puVar5 == plVar4) {
          local_70 = *plVar4;
          lStack_68 = puVar5[3];
          local_80 = &local_70;
        }
        else {
          local_70 = *plVar4;
          local_80 = (long *)*puVar5;
        }
        local_78 = puVar5[1];
        *puVar5 = plVar4;
        puVar5[1] = 0;
        *(undefined1 *)(puVar5 + 2) = 0;
        puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_80);
        plVar4 = puVar5 + 2;
        if ((long *)*puVar5 == plVar4) {
          local_90 = *plVar4;
          lStack_88 = puVar5[3];
          local_a0 = &local_90;
        }
        else {
          local_90 = *plVar4;
          local_a0 = (long *)*puVar5;
        }
        local_98 = puVar5[1];
        *puVar5 = plVar4;
        puVar5[1] = 0;
        *(undefined1 *)(puVar5 + 2) = 0;
        std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_a0);
        if (local_a0 != &local_90) {
          operator_delete(local_a0);
        }
        if (local_80 != &local_70) {
          operator_delete(local_80);
        }
        _Var7._M_p = local_60._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) goto LAB_0011a852;
      }
      ppFVar8 = ppFVar8 + -1;
    } while (ppFVar8 !=
             (local_40->fields).vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

static void GenStructBody(const StructDef &struct_def, std::string *code_ptr,
                          const char *nameprefix) {
  std::string &code = *code_ptr;
  code += "    builder.prep(" + NumToString(struct_def.minalign) + ", 0);\n";
  for (auto it = struct_def.fields.vec.rbegin();
       it != struct_def.fields.vec.rend();
       ++it) {
    auto &field = **it;
    if (field.padding)
      code += "    builder.pad(" + NumToString(field.padding) + ");\n";
    if (IsStruct(field.value.type)) {
      GenStructBody(*field.value.type.struct_def, code_ptr,
                    (field.value.type.struct_def->name + "_").c_str());
    } else {
      code += "    builder.put" + GenMethod(field) + "(";
      code += nameprefix + MakeCamel(field.name, false) + ");\n";
    }
  }
}